

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder_internal.h
# Opt level: O0

void __thiscall basist::approx_move_to_front::use(approx_move_to_front *this,uint32_t index)

{
  int *piVar1;
  int in_ESI;
  vector<int> *in_RDI;
  int y;
  int x;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar2;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar3;
  
  if (in_ESI != 0) {
    piVar1 = basisu::vector<int>::operator[]
                       (in_RDI,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    iVar3 = *piVar1;
    piVar1 = basisu::vector<int>::operator[]
                       (in_RDI,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    iVar2 = *piVar1;
    piVar1 = basisu::vector<int>::operator[](in_RDI,CONCAT44(in_stack_ffffffffffffffdc,iVar2));
    *piVar1 = iVar2;
    piVar1 = basisu::vector<int>::operator[](in_RDI,CONCAT44(iVar3,iVar2));
    *piVar1 = iVar3;
  }
  return;
}

Assistant:

void use(uint32_t index)
		{
			if (index)
			{
				//std::swap(m_values[index / 2], m_values[index]);
				int x = m_values[index / 2];
				int y = m_values[index];
				m_values[index / 2] = y;
				m_values[index] = x;
			}
		}